

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIfif.c
# Opt level: O3

void Abc_NtkPerformIfif(Abc_Ntk_t *pNtk,Ifif_Par_t *pPars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Abc_Obj_t *pObj;
  void *pvVar4;
  bool bVar5;
  Abc_IffMan_t *p;
  Abc_IffObj_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  Abc_IffObj_t *pAVar11;
  long lVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  double dVar16;
  double dVar17;
  
  if (6 < (uint)pPars->pLutLib->LutMax) {
    __assert_fail("pPars->pLutLib->LutMax >= 0 && pPars->pLutLib->LutMax <= IFIF_MAX_LEAVES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIfif.c"
                  ,0x107,"void Abc_NtkPerformIfif(Abc_Ntk_t *, Ifif_Par_t *)");
  }
  if (6 < (uint)pPars->nLutSize) {
    __assert_fail("pPars->nLutSize >= 0 && pPars->nLutSize <= IFIF_MAX_LEAVES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIfif.c"
                  ,0x108,"void Abc_NtkPerformIfif(Abc_Ntk_t *, Ifif_Par_t *)");
  }
  if (6 < (uint)pPars->nDegree) {
    __assert_fail("pPars->nDegree >= 0 && pPars->nDegree <= IFIF_MAX_LEAVES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIfif.c"
                  ,0x109,"void Abc_NtkPerformIfif(Abc_Ntk_t *, Ifif_Par_t *)");
  }
  Abc_NtkToAig(pNtk);
  Abc_NtkLevel(pNtk);
  if (pPars->fVerbose != 0) {
    puts("Running mapper into LUT structures with the following parameters:");
    printf("Pin+Wire: {");
    if (0 < pPars->pLutLib->LutMax) {
      lVar12 = 0;
      do {
        printf(" %3.2f",(double)pPars->pLutDelays[lVar12]);
        lVar12 = lVar12 + 1;
      } while (lVar12 < pPars->pLutLib->LutMax);
    }
    printf(" }  ");
    pcVar8 = "Cascade";
    if (pPars->fCascade == 0) {
      pcVar8 = "Cluster";
    }
    printf("Wire %3.2f  Degree %d  Type: %s\n",(double)pPars->DelayWire,(ulong)(uint)pPars->nDegree,
           pcVar8);
  }
  p = (Abc_IffMan_t *)calloc(1,0x20);
  p->pNtk = pNtk;
  p->pPars = pPars;
  iVar1 = pNtk->vObjs->nSize;
  p->nObjs = iVar1;
  pAVar6 = (Abc_IffObj_t *)calloc((long)iVar1,0x1c);
  p->pObjs = pAVar6;
  pVVar7 = Abc_NtkDfs(pNtk,0);
  if (pVVar7->nSize < 1) {
    bVar5 = true;
  }
  else {
    lVar12 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar7->pArray[lVar12];
      if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
        __assert_fail("Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIfif.c"
                      ,0x122,"void Abc_NtkPerformIfif(Abc_Ntk_t *, Ifif_Par_t *)");
      }
      iVar2 = pObj->Id;
      if (((long)iVar2 < 0) || (iVar1 <= iVar2)) goto LAB_0026607d;
      pAVar11 = pAVar6 + iVar2;
      if (pPars->fCascade == 0) {
        fVar14 = Abc_ObjDelay0(p,pObj);
        pAVar11->Delay[0] = fVar14;
        fVar14 = Abc_ObjDelay1(p,pObj);
        pAVar11->Delay[1] = fVar14;
      }
      else if (-1 < pPars->nDegree) {
        lVar10 = 0;
        do {
          fVar14 = Abc_ObjDelayDegree(p,pObj,(int)lVar10);
          pAVar11->Delay[lVar10] = fVar14;
          bVar5 = lVar10 < pPars->nDegree;
          lVar10 = lVar10 + 1;
        } while (bVar5);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar7->nSize);
    bVar5 = pVVar7->nSize < 1;
  }
  if (pPars->fCascade == 0) {
    fVar14 = 1.0;
  }
  else {
    fVar14 = (float)pPars->nDegree;
  }
  if (!(bool)(pPars->fVeryVerbose == 0 | bVar5)) {
    lVar12 = 0;
    do {
      pvVar4 = pVVar7->pArray[lVar12];
      printf("Node %3d : Lev =%3d   ",(ulong)*(uint *)((long)pvVar4 + 0x10),
             (ulong)(*(uint *)((long)pvVar4 + 0x14) >> 0xc));
      if (0.0 <= fVar14) {
        uVar13 = 0;
        do {
          iVar2 = *(int *)((long)pvVar4 + 0x10);
          if (((long)iVar2 < 0) || (iVar1 <= iVar2)) goto LAB_0026607d;
          printf("Del%d =%4.2f  ",(double)pAVar6[iVar2].Delay[uVar13],uVar13 & 0xffffffff);
          uVar13 = uVar13 + 1;
        } while ((float)(int)uVar13 <= fVar14);
      }
      putchar(10);
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar7->nSize);
  }
  if (pVVar7->pArray != (void **)0x0) {
    free(pVVar7->pArray);
  }
  free(pVVar7);
  pVVar7 = pNtk->vCos;
  iVar2 = pVVar7->nSize;
  lVar12 = (long)iVar2;
  dVar17 = 0.0;
  if (lVar12 < 1) {
    dVar16 = 0.0;
  }
  else {
    fVar15 = 0.0;
    lVar10 = 0;
    do {
      iVar9 = *(int *)(*(long *)(*(long *)(*(long *)(*pVVar7->pArray[lVar10] + 0x20) + 8) +
                                (long)**(int **)((long)pVVar7->pArray[lVar10] + 0x20) * 8) + 0x10);
      if (((long)iVar9 < 0) || (iVar1 <= iVar9)) goto LAB_0026607d;
      if (fVar15 <= pAVar6[iVar9].Delay[(int)fVar14]) {
        fVar15 = pAVar6[iVar9].Delay[(int)fVar14];
      }
      lVar10 = lVar10 + 1;
    } while (lVar12 != lVar10);
    dVar16 = (double)fVar15;
    if (0 < iVar2) {
      lVar10 = 0;
      iVar9 = 0;
      do {
        iVar3 = *(int *)(*(long *)(*(long *)(*(long *)(*pVVar7->pArray[lVar10] + 0x20) + 8) +
                                  (long)**(int **)((long)pVVar7->pArray[lVar10] + 0x20) * 8) + 0x10)
        ;
        if (((long)iVar3 < 0) || (iVar1 <= iVar3)) {
LAB_0026607d:
          __assert_fail("i >= 0 && i < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIfif.c"
                        ,0x33,"Abc_IffObj_t *Abc_IffObj(Abc_IffMan_t *, int)");
        }
        iVar9 = (iVar9 + 1) - (uint)(pAVar6[iVar3].Delay[(int)fVar14] < (float)(dVar16 * 0.9));
        lVar10 = lVar10 + 1;
      } while (lVar12 != lVar10);
      dVar17 = (double)iVar9 * 100.0;
    }
  }
  printf("Critical delay %5.2f. Critical outputs %5.2f %%\n",dVar16,dVar17 / (double)iVar2);
  Abc_NtkIfifStop(p);
  return;
}

Assistant:

void Abc_NtkPerformIfif( Abc_Ntk_t * pNtk, Ifif_Par_t * pPars )
{
    Abc_IffMan_t * p;
    Abc_IffObj_t * pIffObj;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    float Delay, Delay10, DegreeFinal;
    int i, d, Count10;
    assert( pPars->pLutLib->LutMax >= 0 && pPars->pLutLib->LutMax <= IFIF_MAX_LEAVES );
    assert( pPars->nLutSize >= 0 && pPars->nLutSize <= IFIF_MAX_LEAVES );
    assert( pPars->nDegree >= 0 && pPars->nDegree <= IFIF_MAX_LEAVES );
    // convert to AIGs
    Abc_NtkToAig( pNtk );
    Abc_NtkLevel( pNtk );

    // print parameters
    if ( pPars->fVerbose )
    {
        printf( "Running mapper into LUT structures with the following parameters:\n" );
        printf( "Pin+Wire: {" );
        for ( i = 0; i < pPars->pLutLib->LutMax; i++ )
            printf( " %3.2f", pPars->pLutDelays[i] );
        printf( " }  " );    
        printf( "Wire %3.2f  Degree %d  Type: %s\n", 
            pPars->DelayWire, pPars->nDegree, pPars->fCascade? "Cascade" : "Cluster" );
    }

    // start manager
    p = Abc_NtkIfifStart( pNtk, pPars );
//    printf( "Running experiment with LUT delay %d and degree %d (LUT size is %d).\n", DelayWire, nDegree, nLutSize );

    // compute the delay
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        assert( Abc_ObjIsNode(pObj) );
        pIffObj = Abc_IffObj( p, Abc_ObjId(pObj) );

        if ( pPars->fCascade )
        {
            for ( d = 0; d <= pPars->nDegree; d++ )
                pIffObj->Delay[d] = Abc_ObjDelayDegree( p, pObj, d );
        }
        else
        {
            pIffObj->Delay[0] = Abc_ObjDelay0( p, pObj );
            pIffObj->Delay[1] = Abc_ObjDelay1( p, pObj );
        }
    }

    // get final degree number
    if ( pPars->fCascade )
        DegreeFinal = pPars->nDegree;
    else
        DegreeFinal = 1;

    if ( p->pPars->fVeryVerbose )
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        printf( "Node %3d : Lev =%3d   ",  Abc_ObjId(pObj), Abc_ObjLevel(pObj) );
        for ( d = 0; d <= DegreeFinal; d++ )
            printf( "Del%d =%4.2f  ", d, Abc_IffDelay(p, pObj, d) );
        printf( "\n" );
    }
    Vec_PtrFree( vNodes );


    // consider delay at the outputs
    Delay = 0;
    Abc_NtkForEachCo( pNtk, pObj, i )
        Delay = Abc_MaxFloat( Delay, Abc_IffDelay(p, Abc_ObjFanin0(pObj), DegreeFinal) );
    Delay10 = 0.9 * Delay;

    // consider delay at the outputs
    Count10 = 0;
    Abc_NtkForEachCo( pNtk, pObj, i )
        if ( Abc_IffDelay(p, Abc_ObjFanin0(pObj), DegreeFinal) >= Delay10 )
            Count10++;

    printf( "Critical delay %5.2f. Critical outputs %5.2f %%\n", Delay, 100.0 * Count10 / Abc_NtkCoNum(pNtk) );
//    printf( "%.2f %.2f\n", Delay, 100.0 * Count10 / Abc_NtkCoNum(pNtk) );

    // derive a new network

    // stop manager
    Abc_NtkIfifStop( p );
}